

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

void __thiscall BinHash<DnsHashEntry>::Clear(BinHash<DnsHashEntry> *this)

{
  DnsHashEntry **ppDVar1;
  DnsHashEntry *x;
  DnsHashEntry *this_00;
  ulong uVar2;
  
  if (this->hashBin != (DnsHashEntry **)0x0) {
    if (this->tableSize != 0) {
      uVar2 = 0;
      do {
        this_00 = this->hashBin[uVar2];
        if (this_00 != (DnsHashEntry *)0x0) {
          ppDVar1 = this->hashBin + uVar2;
          do {
            *ppDVar1 = this_00->HashNext;
            DnsHashEntry::~DnsHashEntry(this_00);
            operator_delete(this_00);
            ppDVar1 = this->hashBin + uVar2;
            this_00 = *ppDVar1;
          } while (this_00 != (DnsHashEntry *)0x0);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < this->tableSize);
    }
    if (this->hashBin != (DnsHashEntry **)0x0) {
      operator_delete__(this->hashBin);
    }
    this->hashBin = (DnsHashEntry **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }